

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O0

void __thiscall
SplitCompilationTest_empty_list_long_Test<unsigned_char>::TestBody
          (SplitCompilationTest_empty_list_long_Test<unsigned_char> *this)

{
  basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *this_00;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  AssertHelper local_1b0 [8];
  Message local_1a8 [8];
  container_type local_1a0;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_150 [8];
  Message local_148 [8];
  container_type local_140;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f0 [8];
  Message local_e8 [8];
  container_type local_e0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90 [8];
  Message local_88 [24];
  container_type local_70;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> delim
  ;
  basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> empty;
  SplitCompilationTest_empty_list_long_Test<unsigned_char> *this_local;
  
  this_00 = (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)
            ((long)&delim.field_2 + 8);
  std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>::basic_string_view
            (this_00);
  make_delim_long<unsigned_char,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            ((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar_.message_,8,'\0');
  jessilib::
  split<std::__cxx11::list,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_70,this_00,
             (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar_.message_);
  local_51 = std::__cxx11::
             list<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
             ::empty(&local_70);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  std::__cxx11::
  list<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::~list(&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_50,
               "split<std::list>(empty, delim).empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  jessilib::
  split_n<std::__cxx11::list,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_e0,
             (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)
             ((long)&delim.field_2 + 8),
             (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar_.message_,5);
  local_c1 = std::__cxx11::
             list<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
             ::empty(&local_e0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  std::__cxx11::
  list<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::~list(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_c0,
               "split_n<std::list>(empty, delim, 5).empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  jessilib::
  split_view<std::__cxx11::list,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
            (&local_140,
             (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)
             ((long)&delim.field_2 + 8),
             (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar_.message_);
  local_121 = std::__cxx11::
              list<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::allocator<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>_>
              ::empty(&local_140);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  std::__cxx11::
  list<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::allocator<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>_>
  ::~list(&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_120,
               "split_view<std::list>(empty, delim).empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  jessilib::
  split_n_view<std::__cxx11::list,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
            (&local_1a0,
             (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)
             ((long)&delim.field_2 + 8),
             (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar_.message_,5);
  local_181 = std::__cxx11::
              list<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::allocator<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>_>
              ::empty(&local_1a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  std::__cxx11::
  list<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::allocator<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>_>
  ::~list(&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_1d0,local_180,
               "split_n_view<std::list>(empty, delim, 5).empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(local_1b0,local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_list_long) {
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n<std::list>(empty, delim, 5).empty());
	EXPECT_TRUE(split_view<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n_view<std::list>(empty, delim, 5).empty());
}